

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

VectorXd h(VectorXd *x)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  DenseIndex extraout_RDX;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RSI;
  float fVar4;
  float fVar5;
  float fVar6;
  VectorXd VVar7;
  double local_48;
  double local_40;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(x,3);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(in_RSI,0);
  fVar4 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(in_RSI,1);
  fVar5 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(in_RSI,2);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(in_RSI,3);
  dVar2 = *pdVar3;
  local_38.m_row = 0;
  fVar6 = SQRT(fVar4 * fVar4 + fVar5 * fVar5);
  local_38.m_col = 1;
  local_38.m_currentBlockRows = 1;
  *(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double)fVar6;
  local_38.m_xpr = x;
  local_40 = atan2((double)fVar5,(double)fVar4);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                   (&local_38,&local_40);
  local_48 = (double)((fVar4 * (float)dVar1 + fVar5 * (float)dVar2) / fVar6);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this,&local_48);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_38);
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)x;
  return (VectorXd)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd h(const VectorXd &x){
	VectorXd h_(3);
	// read state vector
	float px = x(0);
	float py = x(1);
	float vx = x(2);
	float vy = x(3);

	// pre-compute term
	float c = sqrt(px*px + py*py);

	// set h function
	h_ << c, atan2(py,px), (px*vx + py*vy)/c;
	return h_;
}